

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               ImGuiSliderFlags flags)

{
  int lhs;
  bool bVar1;
  float *pfVar2;
  float fVar3;
  int local_90;
  bool local_8b;
  int local_84;
  bool local_7d;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float v_old_ref_for_accum_remainder;
  int v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int local_50;
  float local_4c;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiContext_conflict *pIStack_40;
  ImGuiAxis axis;
  ImGuiContext *g;
  char *pcStack_30;
  ImGuiSliderFlags flags_local;
  char *format_local;
  float local_20;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int *v_local;
  ImGuiDataType data_type_local;
  
  pIStack_40 = GImGui;
  adjust_delta = (float)(uint)((flags & 0x100000U) != 0);
  decimal_precision._3_1_ = v_min < v_max;
  decimal_precision._2_1_ = (flags & 0x20U) != 0;
  local_7d = data_type == 8 || data_type == 9;
  decimal_precision._1_1_ = local_7d;
  v_max_local = (int)v_speed;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && ((bool)decimal_precision._3_1_)) &&
     ((float)(v_max - v_min) < 3.4028235e+38)) {
    v_max_local = (int)((float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio);
  }
  local_4c = 0.0;
  g._4_4_ = flags;
  pcStack_30 = format;
  format_local._4_4_ = (float)v_max;
  local_20 = (float)v_min;
  _v_min_local = (float *)v;
  v_local._0_4_ = data_type;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIStack_40->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar2 = ImVec2::operator[](&(pIStack_40->IO).MouseDelta,(long)(int)adjust_delta);
    local_4c = *pfVar2;
    if (((pIStack_40->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((pIStack_40->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  else if (pIStack_40->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((decimal_precision._1_1_ & 1) == 0) {
      local_84 = 0;
    }
    else {
      local_84 = ImParseFormatPrecision(pcStack_30,3);
    }
    local_50 = local_84;
    _v_cur = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
    pfVar2 = ImVec2::operator[]((ImVec2 *)&v_cur,(long)(int)adjust_delta);
    lhs = v_max_local;
    local_4c = *pfVar2;
    fVar3 = GetMinimumStepAtDecimalPrecision(local_50);
    v_max_local = (int)ImMax<float>((float)lhs,fVar3);
  }
  local_4c = (float)v_max_local * local_4c;
  if (adjust_delta == 1.4013e-45) {
    local_4c = -local_4c;
  }
  if ((((decimal_precision._2_1_ & 1) != 0) &&
      ((float)((int)format_local._4_4_ - (int)local_20) < 3.4028235e+38)) &&
     (1e-06 < (float)((int)format_local._4_4_ - (int)local_20))) {
    local_4c = local_4c / (float)((int)format_local._4_4_ - (int)local_20);
  }
  local_8b = false;
  if (((decimal_precision._3_1_ & 1) != 0) &&
     (((int)*_v_min_local < (int)format_local._4_4_ || (local_8b = true, local_4c <= 0.0)))) {
    local_8b = (int)*_v_min_local <= (int)local_20 && local_4c < 0.0;
  }
  if (((pIStack_40->ActiveIdIsJustActivated & 1U) != 0) || (local_8b)) {
    pIStack_40->DragCurrentAccum = 0.0;
    pIStack_40->DragCurrentAccumDirty = false;
  }
  else if ((local_4c != 0.0) || (NAN(local_4c))) {
    pIStack_40->DragCurrentAccum = local_4c + pIStack_40->DragCurrentAccum;
    pIStack_40->DragCurrentAccumDirty = true;
  }
  if ((pIStack_40->DragCurrentAccumDirty & 1U) == 0) {
    v_local._7_1_ = false;
  }
  else {
    fVar3 = *_v_min_local;
    zero_deadzone_halfsize = 0.0;
    decimal_precision_1 = 0;
    if ((decimal_precision._2_1_ & 1) == 0) {
      logarithmic_zero_epsilon = (float)((int)pIStack_40->DragCurrentAccum + (int)fVar3);
    }
    else {
      if ((decimal_precision._1_1_ & 1) == 0) {
        local_90 = 1;
      }
      else {
        local_90 = ImParseFormatPrecision(pcStack_30,3);
      }
      decimal_precision_1 = (int)ImPow(0.1,(float)local_90);
      zero_deadzone_halfsize =
           ScaleRatioFromValueT<int,int,float>
                     ((ImGuiDataType)v_local,(int)fVar3,(int)local_20,(int)format_local._4_4_,
                      (bool)(decimal_precision._2_1_ & 1),(float)decimal_precision_1,0.0);
      logarithmic_zero_epsilon =
           (float)ScaleValueFromRatioT<int,int,float>
                            ((ImGuiDataType)v_local,
                             zero_deadzone_halfsize + pIStack_40->DragCurrentAccum,(int)local_20,
                             (int)format_local._4_4_,(bool)(decimal_precision._2_1_ & 1),
                             (float)decimal_precision_1,0.0);
    }
    if ((g._4_4_ & 0x40) == 0) {
      logarithmic_zero_epsilon =
           (float)RoundScalarWithFormatT<int,int>
                            (pcStack_30,(ImGuiDataType)v_local,(int)logarithmic_zero_epsilon);
    }
    pIStack_40->DragCurrentAccumDirty = false;
    if ((decimal_precision._2_1_ & 1) == 0) {
      pIStack_40->DragCurrentAccum =
           pIStack_40->DragCurrentAccum -
           (float)((int)logarithmic_zero_epsilon - (int)*_v_min_local);
    }
    else {
      fVar3 = ScaleRatioFromValueT<int,int,float>
                        ((ImGuiDataType)v_local,(int)logarithmic_zero_epsilon,(int)local_20,
                         (int)format_local._4_4_,(bool)(decimal_precision._2_1_ & 1),
                         (float)decimal_precision_1,0.0);
      pIStack_40->DragCurrentAccum = pIStack_40->DragCurrentAccum - (fVar3 - zero_deadzone_halfsize)
      ;
    }
    if (logarithmic_zero_epsilon == 0.0) {
      logarithmic_zero_epsilon = 0.0;
    }
    if ((*_v_min_local != logarithmic_zero_epsilon) && ((decimal_precision._3_1_ & 1) != 0)) {
      if (((int)logarithmic_zero_epsilon < (int)local_20) ||
         ((((int)*_v_min_local < (int)logarithmic_zero_epsilon && (local_4c < 0.0)) &&
          ((decimal_precision._1_1_ & 1) == 0)))) {
        logarithmic_zero_epsilon = local_20;
      }
      if (((int)format_local._4_4_ < (int)logarithmic_zero_epsilon) ||
         ((((int)logarithmic_zero_epsilon < (int)*_v_min_local && (0.0 < local_4c)) &&
          ((decimal_precision._1_1_ & 1) == 0)))) {
        logarithmic_zero_epsilon = format_local._4_4_;
      }
    }
    if (*_v_min_local == logarithmic_zero_epsilon) {
      v_local._7_1_ = false;
    }
    else {
      *_v_min_local = logarithmic_zero_epsilon;
      v_local._7_1_ = true;
    }
  }
  return v_local._7_1_;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}